

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext *ctx,ExprFunctionAccess *node)

{
  LLVMBuilderRef pLVar1;
  LLVMValueRefOpaque **ppLVar2;
  LLVMTypeRef pLVar3;
  LLVMValueRef pLVar4;
  LLVMValueRef pLVar5;
  LLVMValueRef local_48;
  LLVMValueRef result;
  LLVMValueRef constants [2];
  LLVMValueRef function;
  LLVMValueRef context;
  ExprFunctionAccess *node_local;
  LlvmCompilationContext *ctx_local;
  
  ppLVar2 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,node->function->functionIndex);
  if (*ppLVar2 != (LLVMValueRefOpaque *)0x0) {
    if (node->context == (ExprBase *)0x0) {
      pLVar3 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      local_48 = LLVMConstPointerNull(pLVar3);
    }
    else {
      local_48 = CompileLlvm(ctx,node->context);
    }
    ppLVar2 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                        (&ctx->functions,node->function->functionIndex);
    constants[1] = *ppLVar2;
    pLVar1 = ctx->builder;
    pLVar3 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    pLVar4 = LLVMBuildPointerCast(pLVar1,local_48,pLVar3,"context_ptr");
    pLVar5 = constants[1];
    pLVar1 = ctx->builder;
    pLVar3 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    constants[1] = LLVMBuildPointerCast(pLVar1,pLVar5,pLVar3,"func_ptr");
    pLVar3 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    result = LLVMConstPointerNull(pLVar3);
    pLVar3 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    constants[0] = LLVMConstPointerNull(pLVar3);
    pLVar3 = CompileLlvmType(ctx,(node->super_ExprBase).type);
    pLVar5 = LLVMConstNamedStruct(pLVar3,&result,2);
    pLVar5 = LLVMBuildInsertValue(ctx->builder,pLVar5,pLVar4,0,"");
    pLVar5 = LLVMBuildInsertValue(ctx->builder,pLVar5,constants[1],1,"");
    pLVar5 = CheckType(ctx,&node->super_ExprBase,pLVar5);
    return pLVar5;
  }
  __assert_fail("ctx.functions[node->function->functionIndex]",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x732,
                "LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext &, ExprFunctionAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext &ctx, ExprFunctionAccess *node)
{
	assert(ctx.functions[node->function->functionIndex]);

	LLVMValueRef context = node->context ? CompileLlvm(ctx, node->context) : LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr));
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	context = LLVMBuildPointerCast(ctx.builder, context, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "context_ptr");
	function = LLVMBuildPointerCast(ctx.builder, function, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

	LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

	LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

	result = LLVMBuildInsertValue(ctx.builder, result, context, 0, "");
	result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

	return CheckType(ctx, node, result);
}